

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZEqnArray<double>,_10>::Resize
          (TPZManVector<TPZEqnArray<double>,_10> *this,int64_t newsize)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  ulong *puVar3;
  long lVar4;
  TPZEqnArray<double> *pTVar5;
  TPZManVector<int,_100> *copy;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  if (-1 < newsize) {
    lVar4 = (this->super_TPZVec<TPZEqnArray<double>_>).fNElements;
    if (lVar4 != newsize) {
      lVar6 = (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc;
      if (lVar6 < newsize) {
        if ((ulong)newsize < 0xb) {
          pTVar5 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
          if (pTVar5 != (TPZEqnArray<double> *)&this->field_0x20) {
            if (0 < lVar4) {
              lVar4 = 0;
              lVar6 = 0;
              do {
                pTVar5 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
                puVar1 = (undefined8 *)
                         ((long)(pTVar5->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                         lVar4 + -0x28);
                *(undefined8 *)(&this->field_0x20 + lVar4) = *puVar1;
                TPZManVector<int,_100>::operator=
                          ((TPZManVector<int,_100> *)(&this->field_0x28 + lVar4),
                           (TPZManVector<int,_100> *)(puVar1 + 1));
                TPZManVector<int,_100>::operator=
                          ((TPZManVector<int,_100> *)(&this->field_0x1d8 + lVar4),
                           (TPZManVector<int,_100> *)
                           ((long)(pTVar5->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                           lVar4 + -0x20));
                TPZManVector<double,_1000>::operator=
                          ((TPZManVector<double,_1000> *)(&this->field_0x388 + lVar4),
                           (TPZManVector<double,_1000> *)
                           ((long)(pTVar5->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                           lVar4 + -0x20));
                TPZManVector<int,_1000>::operator=
                          ((TPZManVector<int,_1000> *)(&this->field_0x22e8 + lVar4),
                           (TPZManVector<int,_1000> *)
                           ((long)(pTVar5->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                           lVar4 + -0x20));
                *(undefined4 *)(&this->field_0x32a8 + lVar4) =
                     *(undefined4 *)((long)&pTVar5->fLastTerm + lVar4);
                lVar6 = lVar6 + 1;
                lVar4 = lVar4 + 0x3290;
              } while (lVar6 < (this->super_TPZVec<TPZEqnArray<double>_>).fNElements);
              pTVar5 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
            }
            if (pTVar5 != (TPZEqnArray<double> *)0x0) {
              lVar4 = *(long *)&pTVar5[-1].fLastTerm;
              if (lVar4 != 0) {
                lVar6 = lVar4 * 0x3290;
                do {
                  TPZEqnArray<double>::~TPZEqnArray
                            ((TPZEqnArray<double> *)
                             ((long)pTVar5[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                             lVar6 + -0x28));
                  lVar6 = lVar6 + -0x3290;
                } while (lVar6 != 0);
              }
              operator_delete__(&pTVar5[-1].fLastTerm,lVar4 * 0x3290 | 8);
            }
            (this->super_TPZVec<TPZEqnArray<double>_>).fStore =
                 (TPZEqnArray<double> *)&this->field_0x20;
          }
          (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = 0;
        }
        else {
          dVar9 = (double)lVar6 * 1.2;
          uVar8 = (long)dVar9;
          if (dVar9 < (double)newsize) {
            uVar8 = newsize;
          }
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar8;
          uVar7 = 0xffffffffffffffff;
          if (SUB168(auVar2 * ZEXT816(0x3290),8) == 0) {
            uVar7 = SUB168(auVar2 * ZEXT816(0x3290),0) | 8;
          }
          puVar3 = (ulong *)operator_new__(uVar7);
          *puVar3 = uVar8;
          if (uVar8 != 0) {
            lVar4 = 0;
            pTVar5 = (TPZEqnArray<double> *)(puVar3 + 1);
            do {
              TPZEqnArray<double>::TPZEqnArray(pTVar5);
              lVar4 = lVar4 + -0x3290;
              pTVar5 = pTVar5 + 1;
            } while (uVar8 * -0x3290 - lVar4 != 0);
            lVar4 = (this->super_TPZVec<TPZEqnArray<double>_>).fNElements;
          }
          if (0 < lVar4) {
            lVar4 = 0;
            lVar6 = 0;
            do {
              pTVar5 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
              copy = (TPZManVector<int,_100> *)
                     ((long)(pTVar5->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar4 + -0x20);
              *(undefined8 *)((long)puVar3 + lVar4 + 8) = *(undefined8 *)(copy[-1].fExtAlloc + 0x62)
              ;
              TPZManVector<int,_100>::operator=
                        ((TPZManVector<int,_100> *)((long)puVar3 + lVar4 + 0x10),copy);
              TPZManVector<int,_100>::operator=
                        ((TPZManVector<int,_100> *)((long)puVar3 + lVar4 + 0x1c0),
                         (TPZManVector<int,_100> *)
                         ((long)(pTVar5->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                         lVar4 + -0x20));
              TPZManVector<double,_1000>::operator=
                        ((TPZManVector<double,_1000> *)((long)puVar3 + lVar4 + 0x370),
                         (TPZManVector<double,_1000> *)
                         ((long)(pTVar5->fEqValues).super_TPZManVector<double,_1000>.fExtAlloc +
                         lVar4 + -0x20));
              TPZManVector<int,_1000>::operator=
                        ((TPZManVector<int,_1000> *)((long)puVar3 + lVar4 + 0x22d0),
                         (TPZManVector<int,_1000> *)
                         ((long)(pTVar5->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                         lVar4 + -0x20));
              *(undefined4 *)((long)puVar3 + lVar4 + 0x3290) =
                   *(undefined4 *)((long)&pTVar5->fLastTerm + lVar4);
              lVar6 = lVar6 + 1;
              lVar4 = lVar4 + 0x3290;
            } while (lVar6 < (this->super_TPZVec<TPZEqnArray<double>_>).fNElements);
          }
          pTVar5 = (this->super_TPZVec<TPZEqnArray<double>_>).fStore;
          if (pTVar5 != (TPZEqnArray<double> *)0x0 &&
              pTVar5 != (TPZEqnArray<double> *)&this->field_0x20) {
            lVar4 = *(long *)&pTVar5[-1].fLastTerm;
            if (lVar4 != 0) {
              lVar6 = lVar4 * 0x3290;
              do {
                TPZEqnArray<double>::~TPZEqnArray
                          ((TPZEqnArray<double> *)
                           ((long)pTVar5[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                           lVar6 + -0x28));
                lVar6 = lVar6 + -0x3290;
              } while (lVar6 != 0);
            }
            operator_delete__(&pTVar5[-1].fLastTerm,lVar4 * 0x3290 | 8);
          }
          (this->super_TPZVec<TPZEqnArray<double>_>).fStore = (TPZEqnArray<double> *)(puVar3 + 1);
          (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
          (this->super_TPZVec<TPZEqnArray<double>_>).fNAlloc = uVar8;
        }
      }
      else {
        (this->super_TPZVec<TPZEqnArray<double>_>).fNElements = newsize;
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}